

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::EnumDescriptorProto::EnumDescriptorProto
          (EnumDescriptorProto *this,EnumDescriptorProto *from)

{
  uint uVar1;
  ulong uVar2;
  EnumOptions *from_00;
  LogMessage *other;
  EnumOptions *this_00;
  undefined8 *puVar3;
  LogFinisher local_71;
  InternalMetadata *local_70;
  LogMessage local_68;
  
  local_70 = &(this->super_Message).super_MessageLite._internal_metadata_;
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = 0;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__EnumDescriptorProto_004e23a8;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&(this->value_).super_RepeatedPtrFieldBase.arena_ + 4) = 0;
  (this->value_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->value_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->value_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
            (&(this->value_).super_RepeatedPtrFieldBase,&(from->value_).super_RepeatedPtrFieldBase);
  (this->reserved_range_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->reserved_range_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->reserved_range_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>::TypeHandler>
            (&(this->reserved_range_).super_RepeatedPtrFieldBase,
             &(from->reserved_range_).super_RepeatedPtrFieldBase);
  (this->reserved_name_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->reserved_name_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->reserved_name_).super_RepeatedPtrFieldBase,
             &(from->reserved_name_).super_RepeatedPtrFieldBase);
  uVar2 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (local_70,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffc) + 8));
  }
  (this->name_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 1) != 0) {
    puVar3 = (undefined8 *)(local_70->ptr_ & 0xfffffffffffffffc);
    if ((local_70->ptr_ & 1U) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    internal::ArenaStringPtr::Set
              (&this->name_,(ulong)(from->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe,puVar3);
  }
  uVar1 = (from->_has_bits_).has_bits_[0];
  if (((uVar1 & 2) != 0) && (from->options_ == (EnumOptions *)0x0)) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
               ,0x2ab2);
    other = internal::LogMessage::operator<<
                      (&local_68,"CHECK failed: !value || options_ != nullptr: ");
    internal::LogFinisher::operator=(&local_71,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if ((uVar1 & 2) == 0) {
    this_00 = (EnumOptions *)0x0;
  }
  else {
    from_00 = from->options_;
    this_00 = (EnumOptions *)operator_new(0x50);
    EnumOptions::EnumOptions(this_00,from_00);
  }
  this->options_ = this_00;
  return;
}

Assistant:

EnumDescriptorProto::EnumDescriptorProto(const EnumDescriptorProto& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _has_bits_(from._has_bits_),
      value_(from.value_),
      reserved_range_(from.reserved_range_),
      reserved_name_(from.reserved_name_) {
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (from._internal_has_name()) {
    name_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_name(), 
      GetArenaForAllocation());
  }
  if (from._internal_has_options()) {
    options_ = new ::PROTOBUF_NAMESPACE_ID::EnumOptions(*from.options_);
  } else {
    options_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.EnumDescriptorProto)
}